

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::ProducerIPCClientImpl::~ProducerIPCClientImpl(ProducerIPCClientImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  SharedMemoryArbiter *pSVar3;
  SharedMemory *pSVar4;
  Client *pCVar5;
  
  (this->super_ProducerEndpoint)._vptr_ProducerEndpoint =
       (_func_int **)&PTR__ProducerIPCClientImpl_003a3d68;
  (this->super_EventListener)._vptr_EventListener =
       (_func_int **)&PTR__ProducerIPCClientImpl_003a3e18;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->pending_sync_reqs_);
  pcVar2 = (this->name_)._M_dataplus._M_p;
  paVar1 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&(this->data_sources_setup_)._M_t);
  pSVar3 = (this->shared_memory_arbiter_)._M_t.
           super___uniq_ptr_impl<perfetto::SharedMemoryArbiter,_std::default_delete<perfetto::SharedMemoryArbiter>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::SharedMemoryArbiter_*,_std::default_delete<perfetto::SharedMemoryArbiter>_>
           .super__Head_base<0UL,_perfetto::SharedMemoryArbiter_*,_false>._M_head_impl;
  if (pSVar3 != (SharedMemoryArbiter *)0x0) {
    (*pSVar3->_vptr_SharedMemoryArbiter[1])();
  }
  (this->shared_memory_arbiter_)._M_t.
  super___uniq_ptr_impl<perfetto::SharedMemoryArbiter,_std::default_delete<perfetto::SharedMemoryArbiter>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::SharedMemoryArbiter_*,_std::default_delete<perfetto::SharedMemoryArbiter>_>
  .super__Head_base<0UL,_perfetto::SharedMemoryArbiter_*,_false>._M_head_impl =
       (SharedMemoryArbiter *)0x0;
  pSVar4 = (this->shared_memory_)._M_t.
           super___uniq_ptr_impl<perfetto::SharedMemory,_std::default_delete<perfetto::SharedMemory>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::SharedMemory_*,_std::default_delete<perfetto::SharedMemory>_>
           .super__Head_base<0UL,_perfetto::SharedMemory_*,_false>._M_head_impl;
  if (pSVar4 != (SharedMemory *)0x0) {
    (*pSVar4->_vptr_SharedMemory[1])();
  }
  (this->shared_memory_)._M_t.
  super___uniq_ptr_impl<perfetto::SharedMemory,_std::default_delete<perfetto::SharedMemory>_>._M_t.
  super__Tuple_impl<0UL,_perfetto::SharedMemory_*,_std::default_delete<perfetto::SharedMemory>_>.
  super__Head_base<0UL,_perfetto::SharedMemory_*,_false>._M_head_impl = (SharedMemory *)0x0;
  protos::gen::ProducerPortProxy::~ProducerPortProxy(&this->producer_port_);
  pCVar5 = (this->ipc_channel_)._M_t.
           super___uniq_ptr_impl<perfetto::ipc::Client,_std::default_delete<perfetto::ipc::Client>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::ipc::Client_*,_std::default_delete<perfetto::ipc::Client>_>
           .super__Head_base<0UL,_perfetto::ipc::Client_*,_false>._M_head_impl;
  if (pCVar5 != (Client *)0x0) {
    (*pCVar5->_vptr_Client[1])();
  }
  (this->ipc_channel_)._M_t.
  super___uniq_ptr_impl<perfetto::ipc::Client,_std::default_delete<perfetto::ipc::Client>_>._M_t.
  super__Tuple_impl<0UL,_perfetto::ipc::Client_*,_std::default_delete<perfetto::ipc::Client>_>.
  super__Head_base<0UL,_perfetto::ipc::Client_*,_false>._M_head_impl = (Client *)0x0;
  return;
}

Assistant:

ProducerIPCClientImpl::~ProducerIPCClientImpl() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
}